

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_extract.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *out;
  pointer *out_00;
  FILE *pFVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  pointer pMVar6;
  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
  *pvVar7;
  size_type sVar8;
  size_type sVar9;
  value_type *pvVar10;
  set<long,_std::less<long>,_std::allocator<long>_> *psVar11;
  reference plVar12;
  _Rb_tree_const_iterator<long> in_RCX;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar13;
  char *local_378;
  bool local_339;
  uint local_2f0;
  long i_2;
  iterator __end2;
  iterator __begin2;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2;
  size_type i_1;
  anon_class_40_5_4793491c write_entry;
  path local_278;
  undefined1 local_250 [8];
  string output_basename;
  undefined1 local_228 [8];
  path output_dir;
  undefined1 local_1f0 [8];
  unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> mrg;
  undefined1 local_1e0 [7];
  bool has_nam;
  Nam nam;
  string nam_raw;
  string local_1a0 [32];
  undefined1 local_180 [8];
  string nam_filename;
  undefined1 local_158 [8];
  shared_ptr<mg::fs::MappedFile> mrg_data;
  string hed_raw;
  string local_120 [32];
  undefined1 local_100 [8];
  string mrg_filename;
  string local_d8 [32];
  undefined1 local_b8 [8];
  string hed_filename;
  long local_78;
  long extract_idx;
  char *endptr;
  char *pcStack_60;
  int i;
  char *output_path;
  char *input_basename;
  set<long,_std::less<long>,_std::allocator<long>_> extract_indices;
  bool targeted_extract;
  char **argv_local;
  int argc_local;
  
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&input_basename);
  output_path = (char *)0x0;
  pcStack_60 = (char *)0x0;
  for (endptr._4_4_ = 1; endptr._4_4_ < argc; endptr._4_4_ = endptr._4_4_ + 1) {
    iVar4 = strcmp("-i",argv[endptr._4_4_]);
    if (iVar4 == 0) {
      if (argc <= endptr._4_4_ + 1) {
        fprintf(_stderr,"Missing argument for -i\n");
        argv_local._4_4_ = -1;
        endptr._0_4_ = 1;
        goto LAB_0011020e;
      }
      extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      local_78 = strtol(argv[endptr._4_4_ + 1],(char **)&extract_idx,0);
      if ((char *)extract_idx == argv[endptr._4_4_ + 1]) {
        fprintf(_stderr,"Failed to parse index \'%s\'\n",argv[endptr._4_4_ + 1]);
        argv_local._4_4_ = -1;
        endptr._0_4_ = 1;
        goto LAB_0011020e;
      }
      pVar13 = std::set<long,std::less<long>,std::allocator<long>>::emplace<long&>
                         ((set<long,std::less<long>,std::allocator<long>> *)&input_basename,
                          &local_78);
      in_RCX = pVar13.first._M_node;
      endptr._4_4_ = endptr._4_4_ + 1;
      hed_filename.field_2._8_8_ = in_RCX._M_node;
    }
    else if (output_path == (char *)0x0) {
      in_RCX._M_node = (_Base_ptr)(long)endptr._4_4_;
      output_path = argv[(long)in_RCX._M_node];
    }
    else {
      if (pcStack_60 != (char *)0x0) {
        usage(*argv);
        argv_local._4_4_ = -1;
        endptr._0_4_ = 1;
        goto LAB_0011020e;
      }
      in_RCX._M_node = (_Base_ptr)(long)endptr._4_4_;
      pcStack_60 = argv[(long)in_RCX._M_node];
    }
  }
  if (output_path == (char *)0x0) {
    usage(*argv);
    argv_local._4_4_ = -1;
    endptr._0_4_ = 1;
    goto LAB_0011020e;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"%s.hed",(allocator<char> *)(mrg_filename.field_2._M_local_buf + 0xf));
  mg::string::format<char_const*>
            ((string *)local_b8,(string *)local_d8,(string *)output_path,(char *)in_RCX._M_node);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)(mrg_filename.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"%s.mrg",(allocator<char> *)(hed_raw.field_2._M_local_buf + 0xf));
  mg::string::format<char_const*>
            ((string *)local_100,(string *)local_120,(string *)output_path,(char *)in_RCX._M_node);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)(hed_raw.field_2._M_local_buf + 0xf));
  out = &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::string((string *)out);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar2 = mg::fs::read_file(pcVar5,(string *)out);
  if (bVar2) {
    iVar4 = std::__cxx11::string::c_str();
    mg::fs::MappedFile::open(nam_filename.field_2._M_local_buf + 8,iVar4);
    std::shared_ptr<mg::fs::MappedFile>::
    shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
              ((shared_ptr<mg::fs::MappedFile> *)local_158,
               (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
               ((long)&nam_filename.field_2 + 8));
    std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
              ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
               ((long)&nam_filename.field_2 + 8));
    bVar2 = std::operator==((shared_ptr<mg::fs::MappedFile> *)local_158,(nullptr_t)0x0);
    if (bVar2) {
      argv_local._4_4_ = -1;
      endptr._0_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1a0,"%s.nam",(allocator<char> *)(nam_raw.field_2._M_local_buf + 0xf));
      mg::string::format<char_const*>
                ((string *)local_180,(string *)local_1a0,(string *)output_path,
                 (char *)in_RCX._M_node);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)(nam_raw.field_2._M_local_buf + 0xf));
      out_00 = &nam.names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)out_00);
      mg::data::Nam::Nam((Nam *)local_1e0);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar2 = mg::fs::read_file(pcVar5,(string *)out_00);
      local_339 = false;
      if (bVar2) {
        local_339 = mg::data::nam_read((string *)
                                       &nam.names.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (Nam *)local_1e0);
      }
      mrg._M_t.super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
      ._M_t.super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
      .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ = local_339;
      std::shared_ptr<mg::fs::MappedFile>::shared_ptr
                ((shared_ptr<mg::fs::MappedFile> *)&output_dir._M_cmpts,
                 (shared_ptr<mg::fs::MappedFile> *)local_158);
      mg::data::MappedMrg::parse
                ((MappedMrg *)local_1f0,
                 (string *)
                 &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(shared_ptr<mg::fs::MappedFile> *)&output_dir._M_cmpts);
      std::shared_ptr<mg::fs::MappedFile>::~shared_ptr
                ((shared_ptr<mg::fs::MappedFile> *)&output_dir._M_cmpts);
      bVar2 = std::operator==((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                               *)local_1f0,(nullptr_t)0x0);
      if (bVar2) {
        argv_local._4_4_ = -1;
        endptr._0_4_ = 1;
      }
      else {
        if ((mrg._M_t.
             super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
             _M_t.
             super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
             .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ & 1) != 0) {
          pMVar6 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::
                   operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                               *)local_1f0);
          pvVar7 = mg::data::MappedMrg::entries(pMVar6);
          sVar8 = std::
                  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                  ::size(pvVar7);
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1e0);
          pFVar1 = _stderr;
          if (sVar8 != sVar9) {
            pMVar6 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                     ::operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                   *)local_1f0);
            pvVar7 = mg::data::MappedMrg::entries(pMVar6);
            sVar8 = std::
                    vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ::size(pvVar7);
            sVar9 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1e0);
            fprintf(pFVar1,"MRG entry count (%lu) does not match NAM entry count (%lu)\n",sVar8,
                    sVar9);
            argv_local._4_4_ = -1;
            endptr._0_4_ = 1;
            goto LAB_00110142;
          }
        }
        if (pcStack_60 == (char *)0x0) {
          local_378 = ".";
        }
        else {
          local_378 = pcStack_60;
        }
        output_basename.field_2._8_8_ = local_378;
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  ((path *)local_228,(char **)((long)&output_basename.field_2 + 8),auto_format);
        bVar2 = std::filesystem::exists((path *)local_228);
        if ((bVar2) ||
           (bVar3 = std::filesystem::create_directories((path *)local_228), pFVar1 = _stderr,
           (bVar3 & 1) != 0)) {
          std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                    ((path *)&write_entry.output_dir,&output_path,auto_format);
          std::filesystem::__cxx11::path::stem(&local_278,(path *)&write_entry.output_dir);
          std::filesystem::__cxx11::path::operator_cast_to_string
                    ((string_type *)local_250,&local_278);
          std::filesystem::__cxx11::path::~path(&local_278);
          std::filesystem::__cxx11::path::~path((path *)&write_entry.output_dir);
          i_1 = (size_type)local_250;
          write_entry.output_basename =
               (string *)
               ((long)&mrg._M_t.
                       super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                       .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl + 7);
          write_entry.has_nam = (bool *)local_1e0;
          write_entry.nam = (Nam *)local_1f0;
          write_entry.mrg =
               (unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> *)
               local_228;
          if ((extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
            __range2 = (set<long,_std::less<long>,_std::allocator<long>_> *)0x0;
            while( true ) {
              pMVar6 = std::
                       unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::
                       operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                   *)local_1f0);
              pvVar7 = mg::data::MappedMrg::entries(pMVar6);
              psVar11 = (set<long,_std::less<long>,_std::allocator<long>_> *)
                        std::
                        vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                        ::size(pvVar7);
              if (psVar11 <= __range2) break;
              main::anon_class_40_5_4793491c::operator()
                        ((anon_class_40_5_4793491c *)&i_1,(uint)__range2);
              __range2 = (set<long,_std::less<long>,_std::allocator<long>_> *)
                         &(__range2->_M_t)._M_impl.field_0x1;
            }
          }
          else {
            __end2 = std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                               ((set<long,_std::less<long>,_std::allocator<long>_> *)&input_basename
                               );
            i_2 = (long)std::set<long,_std::less<long>,_std::allocator<long>_>::end
                                  ((set<long,_std::less<long>,_std::allocator<long>_> *)
                                   &input_basename);
            while (bVar2 = std::operator!=(&__end2,(_Self *)&i_2), bVar2) {
              plVar12 = std::_Rb_tree_const_iterator<long>::operator*(&__end2);
              local_2f0 = (uint)*plVar12;
              main::anon_class_40_5_4793491c::operator()((anon_class_40_5_4793491c *)&i_1,local_2f0)
              ;
              std::_Rb_tree_const_iterator<long>::operator++(&__end2);
            }
          }
          argv_local._4_4_ = 0;
          endptr._0_4_ = 1;
          std::__cxx11::string::~string((string *)local_250);
        }
        else {
          pvVar10 = std::filesystem::__cxx11::path::c_str((path *)local_228);
          fprintf(pFVar1,"Failed to create output path \'%s\'\n",pvVar10);
          argv_local._4_4_ = -1;
          endptr._0_4_ = 1;
        }
        std::filesystem::__cxx11::path::~path((path *)local_228);
      }
LAB_00110142:
      std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::~unique_ptr
                ((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> *)
                 local_1f0);
      mg::data::Nam::~Nam((Nam *)local_1e0);
      std::__cxx11::string::~string
                ((string *)
                 &nam.names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_180);
    }
    std::shared_ptr<mg::fs::MappedFile>::~shared_ptr((shared_ptr<mg::fs::MappedFile> *)local_158);
  }
  else {
    argv_local._4_4_ = -1;
    endptr._0_4_ = 1;
  }
  std::__cxx11::string::~string
            ((string *)
             &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_b8);
LAB_0011020e:
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&input_basename);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  bool targeted_extract = false;
  std::set<long> extract_indices;

  const char *input_basename = nullptr;
  const char *output_path = nullptr;
  for (int i = 1; i < argc; i++) {
    if (!strcmp("-i", argv[i])) {
      // Check it is followed by an index
      if (i + 1 >= argc) {
        fprintf(stderr, "Missing argument for -i\n");
        return -1;
      }

      // Entry specifier
      targeted_extract = true;
      char *endptr;
      long extract_idx = strtol(argv[i + 1], &endptr, 0);
      if (endptr == argv[i + 1]) {
        fprintf(stderr, "Failed to parse index '%s'\n", argv[i + 1]);
        return -1;
      }

      // Add to extract set
      extract_indices.emplace(extract_idx);

      // Skip arg and loop
      i++;
      continue;
    }

    // Basename?
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }

    // Output dir?
    if (output_path == nullptr) {
      output_path = argv[i];
      continue;
    }

    // Invalid state
    usage(argv[0]);
    return -1;
  }

  // Check args are OK
  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Test for input files
  const std::string hed_filename = mg::string::format("%s.hed", input_basename);
  const std::string mrg_filename = mg::string::format("%s.mrg", input_basename);

  // Read raw data for hed file
  std::string hed_raw;
  if (!mg::fs::read_file(hed_filename.c_str(), hed_raw)) {
    return -1;
  }

  // Try and map the mrg data
  std::shared_ptr<mg::fs::MappedFile> mrg_data =
      mg::fs::MappedFile::open(mrg_filename.c_str());
  if (mrg_data == nullptr) {
    return -1;
  }

  // Try and read the NAM table as well. If we can't that's OK
  const std::string nam_filename = mg::string::format("%s.nam", input_basename);
  std::string nam_raw;
  mg::data::Nam nam;
  const bool has_nam = mg::fs::read_file(nam_filename.c_str(), nam_raw) &&
                       nam_read(nam_raw, nam);

  // Parse the MRG data
  auto mrg = mg::data::MappedMrg::parse(hed_raw, mrg_data);
  if (mrg == nullptr) {
    return -1;
  }

  // If we have a NAM and MRG, assert that the filename count matches the entry
  // count
  if (has_nam && mrg->entries().size() != nam.names.size()) {
    fprintf(stderr,
            "MRG entry count (%lu) does not match NAM entry count (%lu)\n",
            mrg->entries().size(), nam.names.size());
    return -1;
  }

  // Ensure output dir exists
  std::filesystem::path output_dir = output_path ? output_path : ".";
  if (!std::filesystem::exists(output_dir) &&
      !std::filesystem::create_directories(output_dir)) {
    fprintf(stderr, "Failed to create output path '%s'\n", output_dir.c_str());
    return -1;
  }

  // Utility method to write an index to an output file
  const std::string output_basename =
      std::filesystem::path(input_basename).stem();
  auto write_entry = [&](unsigned index) -> int {
    std::string output_filename =
        mg::string::format("%s.%08lu.dat", output_basename.c_str(), index);

    // If we have a name table, use that name as well
    if (has_nam) {
      output_filename =
          mg::string::format("%s.%08lu.%s.dat", output_basename.c_str(), index,
                             nam.names[index].c_str());
    }

    auto entry_data = mrg->entry_data(index);
    std::filesystem::path output_path = output_dir;
    output_path.append(output_filename);
    if (!mg::fs::write_file(output_path.c_str(), entry_data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %lu bytes to %s\n", entry_data.size(),
            output_path.c_str());

    return 0;
  };

  // Iterate the mrg entries and emit
  if (!targeted_extract) {
    for (std::vector<std::string>::size_type i = 0; i < mrg->entries().size();
         i++) {
      write_entry(i);
    }
  } else {
    for (long i : extract_indices) {
      write_entry(i);
    }
  }

  return 0;
}